

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_parser(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  uint uVar64;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing parser : 61 of 70 functions ...\n");
  }
  iVar1 = test_xmlByteConsumed();
  iVar2 = test_xmlClearNodeInfoSeq();
  iVar3 = test_xmlClearParserCtxt();
  iVar4 = test_xmlCreateDocParserCtxt();
  iVar5 = test_xmlCreatePushParserCtxt();
  iVar6 = test_xmlCtxtReadDoc();
  iVar7 = test_xmlCtxtReadFile();
  iVar8 = test_xmlCtxtReadMemory();
  iVar9 = test_xmlCtxtReset();
  iVar10 = test_xmlCtxtResetPush();
  iVar11 = test_xmlCtxtUseOptions();
  iVar12 = test_xmlGetExternalEntityLoader();
  iVar13 = test_xmlGetFeature();
  iVar14 = test_xmlGetFeaturesList();
  iVar15 = test_xmlHasFeature();
  iVar16 = test_xmlIOParseDTD();
  iVar17 = test_xmlInitNodeInfoSeq();
  iVar18 = test_xmlInitParser();
  iVar19 = test_xmlInitParserCtxt();
  iVar20 = test_xmlKeepBlanksDefault();
  iVar21 = test_xmlLineNumbersDefault();
  iVar22 = test_xmlLoadExternalEntity();
  iVar23 = test_xmlNewIOInputStream();
  iVar24 = test_xmlNewParserCtxt();
  iVar25 = test_xmlParseBalancedChunkMemory();
  iVar26 = test_xmlParseBalancedChunkMemoryRecover();
  iVar27 = test_xmlParseChunk();
  iVar28 = test_xmlParseCtxtExternalEntity();
  iVar29 = test_xmlParseDTD();
  iVar30 = test_xmlParseDoc();
  iVar31 = test_xmlParseDocument();
  iVar32 = test_xmlParseEntity();
  iVar33 = test_xmlParseExtParsedEnt();
  iVar34 = test_xmlParseExternalEntity();
  iVar35 = test_xmlParseFile();
  iVar36 = test_xmlParseInNodeContext();
  iVar37 = test_xmlParseMemory();
  iVar38 = test_xmlParserAddNodeInfo();
  iVar39 = test_xmlParserFindNodeInfo();
  iVar40 = test_xmlParserFindNodeInfoIndex();
  iVar41 = test_xmlParserInputGrow();
  iVar42 = test_xmlParserInputRead();
  iVar43 = test_xmlPedanticParserDefault();
  iVar44 = test_xmlReadDoc();
  iVar45 = test_xmlReadFile();
  iVar46 = test_xmlReadMemory();
  iVar47 = test_xmlRecoverDoc();
  iVar48 = test_xmlRecoverFile();
  iVar49 = test_xmlRecoverMemory();
  iVar50 = test_xmlSAXParseDTD();
  iVar51 = test_xmlSAXParseDoc();
  iVar52 = test_xmlSAXParseEntity();
  iVar53 = test_xmlSAXParseFile();
  iVar54 = test_xmlSAXParseFileWithData();
  iVar55 = test_xmlSAXParseMemory();
  iVar56 = test_xmlSAXParseMemoryWithData();
  iVar57 = test_xmlSAXUserParseFile();
  iVar58 = test_xmlSAXUserParseMemory();
  iVar59 = test_xmlSetExternalEntityLoader();
  iVar60 = test_xmlSetFeature();
  iVar61 = test_xmlSetupParserForBuffer();
  iVar62 = test_xmlStopParser();
  iVar63 = test_xmlSubstituteEntitiesDefault();
  uVar64 = iVar63 + iVar62 + iVar61 + iVar60 + iVar59 + iVar58 + iVar57 + iVar56 + iVar55 + iVar54 +
                                                                                            iVar53 +
                                                                                            iVar52 +
                                                                                            iVar51 +
                                                                                            iVar50 +
                                                                                            iVar49 +
                                                                                            iVar48 +
                                                                                            iVar47 +
                                                                                            iVar46 +
                                                                                            iVar45 +
                                                                                            iVar44 +
                                                                                            iVar43 +
                                                                                            iVar42 +
                                                                                            iVar41 +
                                                                                            iVar40 +
                                                                                            iVar39 +
                                                                                            iVar38 +
                                                                                            iVar37 +
                                                                                            iVar36 +
                                                                                            iVar35 +
                                                                                            iVar34 +
                                                                                            iVar33 +
                                                                                            iVar32 +
                                                                                            iVar31 +
                                                                                            iVar30 +
                                                                                            iVar29 +
                                                                                            iVar28 +
                                                                                            iVar27 +
                                                                                            iVar26 +
                                                                                            iVar25 +
                                                                                            iVar24 +
                                                                                            iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar64 != 0) {
    printf("Module parser: %d errors\n",(ulong)uVar64);
  }
  return uVar64;
}

Assistant:

static int
test_parser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parser : 61 of 70 functions ...\n");
    test_ret += test_xmlByteConsumed();
    test_ret += test_xmlClearNodeInfoSeq();
    test_ret += test_xmlClearParserCtxt();
    test_ret += test_xmlCreateDocParserCtxt();
    test_ret += test_xmlCreatePushParserCtxt();
    test_ret += test_xmlCtxtReadDoc();
    test_ret += test_xmlCtxtReadFile();
    test_ret += test_xmlCtxtReadMemory();
    test_ret += test_xmlCtxtReset();
    test_ret += test_xmlCtxtResetPush();
    test_ret += test_xmlCtxtUseOptions();
    test_ret += test_xmlGetExternalEntityLoader();
    test_ret += test_xmlGetFeature();
    test_ret += test_xmlGetFeaturesList();
    test_ret += test_xmlHasFeature();
    test_ret += test_xmlIOParseDTD();
    test_ret += test_xmlInitNodeInfoSeq();
    test_ret += test_xmlInitParser();
    test_ret += test_xmlInitParserCtxt();
    test_ret += test_xmlKeepBlanksDefault();
    test_ret += test_xmlLineNumbersDefault();
    test_ret += test_xmlLoadExternalEntity();
    test_ret += test_xmlNewIOInputStream();
    test_ret += test_xmlNewParserCtxt();
    test_ret += test_xmlParseBalancedChunkMemory();
    test_ret += test_xmlParseBalancedChunkMemoryRecover();
    test_ret += test_xmlParseChunk();
    test_ret += test_xmlParseCtxtExternalEntity();
    test_ret += test_xmlParseDTD();
    test_ret += test_xmlParseDoc();
    test_ret += test_xmlParseDocument();
    test_ret += test_xmlParseEntity();
    test_ret += test_xmlParseExtParsedEnt();
    test_ret += test_xmlParseExternalEntity();
    test_ret += test_xmlParseFile();
    test_ret += test_xmlParseInNodeContext();
    test_ret += test_xmlParseMemory();
    test_ret += test_xmlParserAddNodeInfo();
    test_ret += test_xmlParserFindNodeInfo();
    test_ret += test_xmlParserFindNodeInfoIndex();
    test_ret += test_xmlParserInputGrow();
    test_ret += test_xmlParserInputRead();
    test_ret += test_xmlPedanticParserDefault();
    test_ret += test_xmlReadDoc();
    test_ret += test_xmlReadFile();
    test_ret += test_xmlReadMemory();
    test_ret += test_xmlRecoverDoc();
    test_ret += test_xmlRecoverFile();
    test_ret += test_xmlRecoverMemory();
    test_ret += test_xmlSAXParseDTD();
    test_ret += test_xmlSAXParseDoc();
    test_ret += test_xmlSAXParseEntity();
    test_ret += test_xmlSAXParseFile();
    test_ret += test_xmlSAXParseFileWithData();
    test_ret += test_xmlSAXParseMemory();
    test_ret += test_xmlSAXParseMemoryWithData();
    test_ret += test_xmlSAXUserParseFile();
    test_ret += test_xmlSAXUserParseMemory();
    test_ret += test_xmlSetExternalEntityLoader();
    test_ret += test_xmlSetFeature();
    test_ret += test_xmlSetupParserForBuffer();
    test_ret += test_xmlStopParser();
    test_ret += test_xmlSubstituteEntitiesDefault();

    if (test_ret != 0)
	printf("Module parser: %d errors\n", test_ret);
    return(test_ret);
}